

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

double __thiscall
chrono::fea::ChElementShellANCF_3423::Calc_detJ0
          (ChElementShellANCF_3423 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny,
          ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ChElementShellANCF_3423 *this_00;
  ChMatrixNM<double,_8,_3> *pCVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0> local_40;
  
  dVar12 = y;
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  this_00 = this;
  ShapeFunctionsDerivativeY(this,Ny,x,dVar12,z);
  ShapeFunctionsDerivativeZ(this_00,Nz,x,y,z);
  pCVar9 = &this->m_d0;
  local_40.m_lhs = Nx;
  local_40.m_rhs = pCVar9;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            (Nx_d0,&local_40);
  local_40.m_lhs = Ny;
  local_40.m_rhs = pCVar9;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            (Ny_d0,&local_40);
  local_40.m_lhs = Nz;
  local_40.m_rhs = pCVar9;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            (Nz_d0,&local_40);
  dVar12 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar12;
  dVar1 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar2 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  dVar4 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  dVar5 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5;
  dVar6 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar7 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7;
  dVar8 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3 * dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar12 * dVar1 * dVar4;
  auVar15 = vfmadd231sd_fma(auVar20,auVar18,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar7 * dVar6;
  auVar15 = vfmadd213sd_fma(auVar16,auVar21,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * dVar2;
  auVar15 = vfnmadd213sd_fma(auVar10,auVar19,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar8 * dVar1;
  auVar15 = vfnmadd213sd_fma(auVar17,auVar14,auVar15);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6 * dVar5;
  auVar15 = vfnmadd213sd_fma(auVar11,auVar13,auVar15);
  return auVar15._0_8_;
}

Assistant:

double ChElementShellANCF_3423::Calc_detJ0(double x,
                                           double y,
                                           double z,
                                           ShapeVector& Nx,
                                           ShapeVector& Ny,
                                           ShapeVector& Nz,
                                           ChMatrixNM<double, 1, 3>& Nx_d0,
                                           ChMatrixNM<double, 1, 3>& Ny_d0,
                                           ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}